

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O0

bool __thiscall xLearn::InmemReader::hash_binary(InmemReader *this,string *filename)

{
  bool bVar1;
  uint64_t uVar2;
  uint64 hash_2;
  uint64 hash_1;
  FILE *file;
  string bin_file;
  char *in_stack_00000138;
  char *in_stack_00000140;
  size_t in_stack_000001e8;
  char *in_stack_000001f0;
  FILE *in_stack_000001f8;
  undefined1 in_stack_00000347;
  string *in_stack_00000348;
  undefined7 in_stack_ffffffffffffff98;
  undefined1 in_stack_ffffffffffffff9f;
  string local_38 [48];
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  byte bVar3;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_ffffffffffffff9f,in_stack_ffffffffffffff98),(char *)local_38);
  std::__cxx11::string::c_str();
  bVar1 = FileExist((char *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
  if (bVar1) {
    std::__cxx11::string::c_str();
    OpenFileOrDie(in_stack_00000140,in_stack_00000138);
    ReadDataFromDisk(in_stack_000001f8,in_stack_000001f0,in_stack_000001e8);
    uVar2 = HashFile(in_stack_00000348,(bool)in_stack_00000347);
    if (uVar2 == 0) {
      ReadDataFromDisk(in_stack_000001f8,in_stack_000001f0,in_stack_000001e8);
      uVar2 = HashFile(in_stack_00000348,(bool)in_stack_00000347);
      if (uVar2 == 0) {
        Close((FILE *)filename);
        bVar3 = 1;
      }
      else {
        Close((FILE *)filename);
        bVar3 = 0;
      }
    }
    else {
      Close((FILE *)filename);
      bVar3 = 0;
    }
  }
  else {
    bVar3 = 0;
  }
  std::__cxx11::string::~string(local_38);
  return (bool)(bVar3 & 1);
}

Assistant:

bool InmemReader::hash_binary(const std::string& filename) {
  std::string bin_file = filename + ".bin";
  // If the ".bin" file does not exists, return false.
  if (!FileExist(bin_file.c_str())) { return false; }
#ifndef _MSC_VER
  FILE* file = OpenFileOrDie(bin_file.c_str(), "r");
#else
  FILE* file = OpenFileOrDie(bin_file.c_str(), "rb");
#endif
  // Check the first hash value
  uint64 hash_1 = 0;
  ReadDataFromDisk(file, (char*)&hash_1, sizeof(hash_1));
  if (hash_1 != HashFile(filename, true)) {
    Close(file);
    return false;
  }
  // Check the second hash value
  uint64 hash_2 = 0;
  ReadDataFromDisk(file, (char*)&hash_2, sizeof(hash_2));
  if (hash_2 != HashFile(filename, false)) {
    Close(file);
    return false;
  }
  Close(file);
  return true;
}